

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

type __thiscall duckdb::Deserializer::Read<duckdb::TableFilterType>(Deserializer *this)

{
  long *in_RDI;
  string str;
  string local_30 [47];
  TableFilterType local_1;
  
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    local_1 = Read<unsigned_char>((Deserializer *)0xb65812);
  }
  else {
    (**(code **)(*in_RDI + 0xd0))();
    ::std::__cxx11::string::c_str();
    local_1 = EnumUtil::FromString<duckdb::TableFilterType>((char *)0xb657d4);
    ::std::__cxx11::string::~string(local_30);
  }
  return local_1;
}

Assistant:

inline typename std::enable_if<std::is_enum<T>::value, T>::type Read() {
		if (deserialize_enum_from_string) {
			auto str = ReadString();
			return EnumUtil::FromString<T>(str.c_str());
		} else {
			return (T)Read<typename std::underlying_type<T>::type>();
		}
	}